

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall
sptk::reaper::EpochTracker::NormalizeAmplitude
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float sample_rate,
          vector<float,_std::allocator<float>_> *output)

{
  float fVar1;
  pointer pfVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  int local_ac;
  vector<float,_std::allocator<float>_> wind;
  
  fVar1 = this->ref_dur_;
  wind.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  wind.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  wind.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar11 = (int)((ulong)((long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  std::vector<float,_std::allocator<float>_>::resize(output,(long)iVar11);
  uVar10 = (uint)(fVar1 * sample_rate + 0.5);
  Window(this,input,0,(long)(int)uVar10,
         (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
         ._M_start);
  uVar7 = (long)(int)uVar10 / 2 & 0xffffffff;
  fVar1 = sample_rate * this->internal_frame_interval_ + 0.5;
  uVar9 = (uint)fVar1;
  uVar4 = uVar10;
  if ((int)uVar10 < 1) {
    uVar4 = 0;
  }
  lVar12 = 0;
  dVar14 = 0.0;
  local_ac = 0;
  for (lVar8 = 0; iVar5 = (int)uVar7, lVar8 < (int)(iVar11 - uVar10); lVar8 = lVar8 + (int)uVar9) {
    dVar13 = 1.0;
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      dVar3 = (double)((this->window_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7] *
                      *(float *)((long)(input->super__Vector_base<float,_std::allocator<float>_>).
                                       _M_impl.super__Vector_impl_data._M_start + uVar7 * 4 + lVar12
                                ));
      dVar13 = dVar13 + dVar3 * dVar3;
    }
    dVar13 = (double)(int)uVar10 / dVar13;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    if (lVar8 < 1) {
      dVar3 = 0.0;
      dVar14 = dVar13;
    }
    else {
      dVar3 = (dVar13 - dVar14) / (double)(int)fVar1;
    }
    pfVar2 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)local_ac;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    local_ac = local_ac + iVar5;
    for (; local_ac != lVar6; lVar6 = lVar6 + 1) {
      (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = (float)((double)pfVar2[lVar6] * dVar14);
      dVar14 = dVar14 + dVar3;
    }
    lVar12 = lVar12 + (long)(int)uVar9 * 4;
    uVar7 = (ulong)uVar9;
  }
  pfVar2 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar8 = (long)local_ac; lVar8 < iVar11; lVar8 = lVar8 + 1) {
    (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar8] = (float)((double)pfVar2[lVar8] * dVar14);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&wind.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void EpochTracker::NormalizeAmplitude(const std::vector<float>& input,
                                      float sample_rate,
                                      std::vector<float>* output) {
  int32_t n_input = input.size();
  int32_t ref_size = RoundUp(sample_rate * ref_dur_);
  std::vector<float> wind;

  output->resize(n_input);
  // Just calling Window here to create a Hann window in window_.
  Window(input, 0, ref_size, &(output->front()));
  int32_t ref_by_2 = ref_size / 2;
  int32_t frame_step = RoundUp(sample_rate * internal_frame_interval_);
  int32_t limit = n_input - ref_size;
  int32_t frame_limit = ref_by_2;
  int32_t data_p = 0;
  int32_t frame_p = 0;
  double old_inv_rms = 0.0;
  while (frame_p < limit) {
    double ref_energy = 1.0;  // to prevent divz
    for (int32_t i = 0; i < ref_size; ++i) {
      double val = window_[i] * input[i + frame_p];
      ref_energy += (val * val);
    }
    double inv_rms = sqrt(static_cast<double>(ref_size) / ref_energy);
    double delta_inv_rms = 0.0;
    if (frame_p > 0) {
      delta_inv_rms = (inv_rms - old_inv_rms) / frame_step;
    } else {
      old_inv_rms = inv_rms;
    }
    for (int i = 0; i < frame_limit; ++i, ++data_p) {
      (*output)[data_p] = input[data_p] * old_inv_rms;
      old_inv_rms += delta_inv_rms;
    }
    frame_limit = frame_step;
    frame_p += frame_step;
  }
  for ( ; data_p < n_input; ++data_p) {
    (*output)[data_p] = input[data_p] * old_inv_rms;
  }
}